

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

void __thiscall QNetworkReplyHttpImplPrivate::_q_startOperation(QNetworkReplyHttpImplPrivate *this)

{
  if ((int)this->state < 2) {
    this->state = Working;
    postRequest(this,&(this->super_QNetworkReplyPrivate).request);
    setupTransferTimeout(this);
    if (this->synchronous == true) {
      this->state = Finished;
      QNetworkReply::setFinished
                (*(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8,true);
      return;
    }
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::_q_startOperation()
{
    // Ensure this function is only being called once, and not at all if we were
    // cancelled
    if (state >= Working)
        return;

    state = Working;

    postRequest(request);

    setupTransferTimeout();
    if (synchronous) {
        state = Finished;
        q_func()->setFinished(true);
    }
}